

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTcPrsOpSub::eval_constant(CTcPrsOpSub *this,CTcPrsNode *left,CTcPrsNode *right)

{
  int iVar1;
  tc_constval_type_t tVar2;
  tc_constval_type_t tVar3;
  undefined4 extraout_var;
  CTcConstVal *pCVar4;
  undefined4 extraout_var_00;
  CTPNListBase *this_00;
  CTPNListBase *this_01;
  CTcPrsNode *pCVar5;
  long *in_RDX;
  CTcPrsNode *in_RSI;
  CTPNListEle *ele;
  CTPNList *lst;
  tc_constval_type_t typ2;
  tc_constval_type_t typ1;
  CTcPrsNode *in_stack_00000118;
  CTcPrsNode *in_stack_00000120;
  CTcPrsOpArith *in_stack_00000128;
  CTcConstVal *in_stack_ffffffffffffffc8;
  CTcPrsNode *local_8;
  
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2544d7);
  if ((iVar1 == 0) || (iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2544ea), iVar1 == 0)) {
    local_8 = (CTcPrsNode *)0x0;
  }
  else {
    iVar1 = (*(in_RSI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    tVar2 = CTcConstVal::get_type((CTcConstVal *)CONCAT44(extraout_var,iVar1));
    pCVar4 = (CTcConstVal *)(**(code **)(*in_RDX + 8))();
    tVar3 = CTcConstVal::get_type(pCVar4);
    if (((tVar2 == TC_CVT_INT) || (tVar2 == TC_CVT_FLOAT)) &&
       ((tVar3 == TC_CVT_INT || (tVar3 == TC_CVT_FLOAT)))) {
      local_8 = CTcPrsOpArith::eval_constant(in_stack_00000128,in_stack_00000120,in_stack_00000118);
    }
    else if (tVar2 == TC_CVT_LIST) {
      iVar1 = (*(in_RSI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
      this_00 = &CTcConstVal::get_val_list((CTcConstVal *)CONCAT44(extraout_var_00,iVar1))->
                 super_CTPNListBase;
      local_8 = in_RSI;
      if (tVar3 == TC_CVT_LIST) {
        pCVar4 = (CTcConstVal *)(**(code **)(*in_RDX + 8))();
        this_01 = &CTcConstVal::get_val_list(pCVar4)->super_CTPNListBase;
        for (pCVar4 = (CTcConstVal *)CTPNListBase::get_head(this_01); pCVar4 != (CTcConstVal *)0x0;
            pCVar4 = (CTcConstVal *)CTPNListEleBase::get_next((CTPNListEleBase *)pCVar4)) {
          pCVar5 = CTPNListEleBase::get_expr((CTPNListEleBase *)pCVar4);
          (*(pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
          CTPNListBase::remove_element(this_00,pCVar4);
        }
      }
      else {
        (**(code **)(*in_RDX + 8))();
        CTPNListBase::remove_element(this_00,in_stack_ffffffffffffffc8);
      }
    }
    else if (tVar2 == TC_CVT_OBJ) {
      local_8 = (CTcPrsNode *)0x0;
    }
    else {
      CTcTokenizer::log_error(0x2b1a);
      local_8 = (CTcPrsNode *)0x0;
    }
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpSub::eval_constant(CTcPrsNode *left,
                                       CTcPrsNode *right) const
{
    if (left->is_const() && right->is_const())
    {
        tc_constval_type_t typ1, typ2;

        /* get the types */
        typ1 = left->get_const_val()->get_type();
        typ2 = right->get_const_val()->get_type();

        /* check our types */
        if ((typ1 == TC_CVT_INT || typ1 == TC_CVT_FLOAT)
            && (typ2 == TC_CVT_INT || typ2 == TC_CVT_FLOAT))
        {
            /* int/float minus int/float - use the inherited handling */
            return CTcPrsOpArith::eval_constant(left, right);
        }
        else if (typ1 == TC_CVT_LIST)
        {
            /* get the original list */
            CTPNList *lst = left->get_const_val()->get_val_list();

            /* 
             *   if the right side is a list, remove each element of that
             *   list from the list on the left; otherwise, remove the
             *   value on the right from the list on the left 
             */
            if (typ2 == TC_CVT_LIST)
            {
                /* remove each element of the rhs list from the lhs list */
                CTPNListEle *ele;

                /* scan the list, adding each element */
                for (ele = right->get_const_val()
                           ->get_val_list()->get_head() ;
                     ele != 0 ; ele = ele->get_next())
                {
                    /* add this element's underlying expression value */
                    lst->remove_element(ele->get_expr()->get_const_val());
                }
            }
            else
            {
                /* remove the rhs value from the lhs list */
                lst->remove_element(right->get_const_val());
            }
        }
        else if (typ1 == TC_CVT_OBJ)
        {
            /* 
             *   assume it's an overloaded operator, in which case constant
             *   evaluation isn't possible, but it could still be a legal
             *   expression 
             */
            return 0;
        }
        else
        {
            /* these types are incompatible - log an error */
            G_tok->log_error(TCERR_CONST_BINMINUS_INCOMPAT);
            return 0;
        }

        /* return the updated left side */
        return left;
    }
    else
    {
        /* they're not constant - we can't generate a constant result */
        return 0;
    }
}